

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O0

void __thiscall FTOutline::lineTo(FTOutline *this,VPointF *pt)

{
  SW_FT_Pos SVar1;
  VPointF *in_RSI;
  FTOutline *in_RDI;
  float fVar2;
  
  fVar2 = VPointF::x(in_RSI);
  SVar1 = TO_FT_COORD(in_RDI,fVar2);
  (in_RDI->ft).points[(in_RDI->ft).n_points].x = SVar1;
  fVar2 = VPointF::y(in_RSI);
  SVar1 = TO_FT_COORD(in_RDI,fVar2);
  (in_RDI->ft).points[(in_RDI->ft).n_points].y = SVar1;
  (in_RDI->ft).tags[(in_RDI->ft).n_points] = '\x01';
  (in_RDI->ft).n_points = (in_RDI->ft).n_points + 1;
  return;
}

Assistant:

void FTOutline::lineTo(const VPointF &pt)
{
    assert(ft.n_points <= SHRT_MAX - 1);

    ft.points[ft.n_points].x = TO_FT_COORD(pt.x());
    ft.points[ft.n_points].y = TO_FT_COORD(pt.y());
    ft.tags[ft.n_points] = SW_FT_CURVE_TAG_ON;
    ft.n_points++;
}